

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O2

void Ssw_SmlSavePattern1(Ssw_Man_t *p,int fInit)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  int iVar4;
  
  memset(p->pPatWords,0xff,(long)p->nPatWords << 2);
  if (fInit != 0) {
    pAVar2 = p->pAig;
    iVar1 = pAVar2->nTruePis;
    for (iVar4 = 0; iVar4 < pAVar2->nRegs; iVar4 = iVar4 + 1) {
      Vec_PtrEntry(pAVar2->vCis,pAVar2->nTruePis + iVar4);
      iVar3 = p->nFrames * iVar1 + iVar4;
      p->pPatWords[iVar3 >> 5] = p->pPatWords[iVar3 >> 5] ^ 1 << ((byte)iVar3 & 0x1f);
      pAVar2 = p->pAig;
    }
  }
  return;
}

Assistant:

void Ssw_SmlSavePattern1( Ssw_Man_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i, k, nTruePis;
    memset( p->pPatWords, 0xff, sizeof(unsigned) * p->nPatWords );
    if ( !fInit )
        return;
    // clear the state bits to correspond to all-0 initial state
    nTruePis = Saig_ManPiNum(p->pAig);
    k = 0;
    Saig_ManForEachLo( p->pAig, pObj, i )
        Abc_InfoXorBit( p->pPatWords, nTruePis * p->nFrames + k++ );
}